

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryMonitor.cpp
# Opt level: O0

uint __thiscall MemoryMonitor::getTotalMemory(MemoryMonitor *this)

{
  uint uVar1;
  int iVar2;
  ValueHashTableOfEnumerator<unsigned_int,_xercesc_4_0::PtrHasher> *this_00;
  undefined4 extraout_var;
  ValueHashTableOfEnumerator<unsigned_int,_xercesc_4_0::PtrHasher> *memEnum;
  uint total;
  MemoryMonitor *this_local;
  
  memEnum._4_4_ = 0;
  this_00 = (ValueHashTableOfEnumerator<unsigned_int,_xercesc_4_0::PtrHasher> *)operator_new(0x28);
  ValueHashTableOfEnumerator<unsigned_int,_xercesc_4_0::PtrHasher>::ValueHashTableOfEnumerator
            (this_00,this->fHashTable,false);
  while( true ) {
    uVar1 = (*(this_00->super_XMLEnumerator<unsigned_int>)._vptr_XMLEnumerator[2])();
    if ((uVar1 & 1) == 0) break;
    iVar2 = (*(this_00->super_XMLEnumerator<unsigned_int>)._vptr_XMLEnumerator[3])();
    memEnum._4_4_ = *(int *)CONCAT44(extraout_var,iVar2) + memEnum._4_4_;
  }
  if (this_00 != (ValueHashTableOfEnumerator<unsigned_int,_xercesc_4_0::PtrHasher> *)0x0) {
    (*(this_00->super_XMLEnumerator<unsigned_int>)._vptr_XMLEnumerator[1])();
  }
  return memEnum._4_4_;
}

Assistant:

unsigned int MemoryMonitor::getTotalMemory()
{
    unsigned int total = 0;
    ValueHashTableOfEnumerator<unsigned int> *memEnum =
            new ValueHashTableOfEnumerator<unsigned int>(fHashTable);
    while(memEnum->hasMoreElements()) {
        total += memEnum->nextElement();
    }
    delete memEnum;
    return total;
}